

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_write_deep_tile_chunk
          (exr_context_t ctxt,int part_index,int tilex,int tiley,int levelx,int levely,
          void *packed_data,uint64_t packed_size,uint64_t unpacked_size,void *sample_data,
          uint64_t sample_data_size)

{
  undefined8 unaff_RBP;
  int in_ESI;
  long in_RDI;
  undefined8 unaff_R14;
  int levelx_00;
  exr_priv_part_t unaff_retaddr;
  undefined4 in_stack_00000008;
  int in_stack_0000000c;
  exr_context_t in_stack_00000010;
  exr_priv_part_t part;
  exr_result_t rv;
  uint64_t in_stack_00000058;
  exr_const_context_t_conflict in_stack_ffffffffffffff90;
  exr_const_context_t_conflict c;
  exr_result_t local_1c;
  
  levelx_00 = (int)((ulong)unaff_R14 >> 0x20);
  if (in_RDI == 0) {
    local_1c = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffff90);
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock(in_stack_ffffffffffffff90);
      local_1c = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else if (*(int *)(*(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8) + 4) == 1) {
      internal_exr_unlock(in_stack_ffffffffffffff90);
      local_1c = (**(code **)(in_RDI + 0x38))(in_RDI,0x1e);
    }
    else {
      c = (exr_const_context_t_conflict)CONCAT44(in_stack_0000000c,in_stack_00000008);
      local_1c = write_tile_chunk(in_stack_00000010,in_stack_0000000c,unaff_retaddr,
                                  (int)((ulong)unaff_RBP >> 0x20),(int)unaff_RBP,levelx_00,(int)part
                                  ,(void *)CONCAT44(levely,rv),CONCAT44(tiley,levelx),
                                  CONCAT44(part_index,tilex),ctxt,in_stack_00000058);
      internal_exr_unlock(c);
    }
  }
  return local_1c;
}

Assistant:

exr_result_t
exr_write_deep_tile_chunk (
    exr_context_t ctxt,
    int           part_index,
    int           tilex,
    int           tiley,
    int           levelx,
    int           levely,
    const void*   packed_data,
    uint64_t      packed_size,
    uint64_t      unpacked_size,
    const void*   sample_data,
    uint64_t      sample_data_size)
{
    exr_result_t rv;
    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (part->storage_mode == EXR_STORAGE_TILED)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_USE_TILE_NONDEEP_WRITE));

    rv = write_tile_chunk (
        ctxt,
        part_index,
        part,
        tilex,
        tiley,
        levelx,
        levely,
        packed_data,
        packed_size,
        unpacked_size,
        sample_data,
        sample_data_size);
    return EXR_UNLOCK_AND_RETURN (rv);
}